

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

HighsInt __thiscall
HighsDomain::propagateRowLower
          (HighsDomain *this,HighsInt *Rindex,double *Rvalue,HighsInt Rlen,double Rlower,
          HighsCDouble *maxactivity,HighsInt ninfmax,HighsDomainChange *boundchgs)

{
  double *pdVar1;
  HighsInt HVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  HighsCDouble boundVal;
  int local_74;
  HighsCDouble local_70;
  HighsCDouble *local_60;
  HighsCDouble local_58;
  double local_40;
  ulong local_38;
  
  local_74 = 0;
  if (ninfmax < 2) {
    local_38 = (ulong)(uint)Rlen;
    local_74 = 0;
    local_60 = maxactivity;
    local_40 = Rlower;
    for (uVar4 = 0; local_38 != uVar4; uVar4 = uVar4 + 1) {
      dVar5 = activityContributionMax
                        (Rvalue[uVar4],
                         (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + Rindex[uVar4],
                         (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + Rindex[uVar4]);
      if (ninfmax == 1) {
        if (INFINITY <= dVar5) {
          local_58 = *maxactivity;
          goto LAB_002a21f4;
        }
      }
      else {
        local_58 = HighsCDouble::operator-(maxactivity,dVar5);
LAB_002a21f4:
        local_70 = operator-(local_40,&local_58);
        boundVal = HighsCDouble::operator/(&local_70,Rvalue[uVar4]);
        dVar5 = ABS((boundVal.hi + boundVal.lo) * 1e-14);
        pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (dVar5 < *pdVar1 || dVar5 == *pdVar1) {
          lVar3 = (long)local_74;
          if (0.0 < Rvalue[uVar4] || Rvalue[uVar4] == 0.0) {
            dVar5 = adjustedLb(this,Rindex[uVar4],boundVal,(bool *)&local_70);
            maxactivity = local_60;
            if (local_70.hi._0_1_ == '\x01') {
              HVar2 = Rindex[uVar4];
              local_74 = local_74 + 1;
              boundchgs[lVar3].boundval = dVar5;
              boundchgs[lVar3].column = HVar2;
              boundchgs[lVar3].boundtype = kLower;
            }
          }
          else {
            dVar5 = adjustedUb(this,Rindex[uVar4],boundVal,(bool *)&local_70);
            maxactivity = local_60;
            if (local_70.hi._0_1_ == '\x01') {
              HVar2 = Rindex[uVar4];
              local_74 = local_74 + 1;
              boundchgs[lVar3].boundval = dVar5;
              boundchgs[lVar3].column = HVar2;
              boundchgs[lVar3].boundtype = kUpper;
            }
          }
        }
      }
    }
  }
  return local_74;
}

Assistant:

HighsInt HighsDomain::propagateRowLower(const HighsInt* Rindex,
                                        const double* Rvalue, HighsInt Rlen,
                                        double Rlower,
                                        const HighsCDouble& maxactivity,
                                        HighsInt ninfmax,
                                        HighsDomainChange* boundchgs) {
  assert(std::isfinite(double(maxactivity)));
  if (ninfmax > 1) return 0;
  HighsInt numchgs = 0;
  for (HighsInt i = 0; i != Rlen; ++i) {
    HighsCDouble maxresact;
    double actcontribution = activityContributionMax(
        Rvalue[i], col_lower_[Rindex[i]], col_upper_[Rindex[i]]);
    if (ninfmax == 1) {
      if (actcontribution != kHighsInf) continue;

      maxresact = maxactivity;
    } else {
      maxresact = maxactivity - actcontribution;
    }

    HighsCDouble boundVal = (Rlower - maxresact) / Rvalue[i];
    if (std::fabs(double(boundVal) * kHighsTiny) > mipsolver->mipdata_->feastol)
      continue;

    if (Rvalue[i] < 0) {
      bool accept;

      double bound = adjustedUb(Rindex[i], boundVal, accept);
      if (accept)
        boundchgs[numchgs++] = {bound, Rindex[i], HighsBoundType::kUpper};
    } else {
      bool accept;

      double bound = adjustedLb(Rindex[i], boundVal, accept);
      if (accept)
        boundchgs[numchgs++] = {bound, Rindex[i], HighsBoundType::kLower};
    }
  }

  return numchgs;
}